

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulate.cc
# Opt level: O1

bool __thiscall
sfm::Triangulate::triangulate
          (Triangulate *this,
          vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> *poses,
          vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *positions,
          Vec3d *track_pos,Statistics *stats,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *outliers)

{
  float fVar1;
  double dVar2;
  unsigned_long uVar3;
  pointer puVar4;
  pointer pVVar5;
  double dVar6;
  pointer puVar7;
  Statistics *pSVar8;
  ulong uVar9;
  pointer ppCVar10;
  invalid_argument *this_00;
  long lVar11;
  pointer *ppVVar12;
  CameraPose *pCVar13;
  Vector<float,_2> *pVVar14;
  Matrix<double,_3,_3> *pMVar15;
  ulong uVar16;
  bool bVar17;
  size_type __n;
  long lVar18;
  pointer *ppVVar19;
  long lVar20;
  float fVar21;
  float afStack_190 [2];
  double local_188;
  long local_180;
  Statistics *local_178;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_170;
  Vec3d *local_168;
  ulong local_160;
  ulong local_158;
  float local_150 [2];
  Vec3f best_pos;
  Vec3d tmp_pos;
  Vec3d ray0;
  pointer pVStack_108;
  Matrix<double,_3,_3> ret;
  undefined1 auStack_b8 [8];
  vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> position_pair;
  vector<unsigned_long,_std::allocator<unsigned_long>_> best_outliers;
  vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_> pose_pair;
  pointer pVStack_68;
  Vec3d camera_pos;
  pointer pVStack_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmp_outliers;
  
  uVar9 = (long)(poses->
                super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(poses->
                super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  local_170 = outliers;
  local_168 = track_pos;
  if (uVar9 < 2) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"At least two poses required");
LAB_0011380d:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __n = (long)(positions->
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(positions->
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar9 != __n) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Poses and positions size mismatch");
    goto LAB_0011380d;
  }
  local_178 = stats;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,__n,(allocator_type *)&pVStack_108);
  best_pos.v[0] = 0.0;
  local_150[0] = 0.0;
  local_150[1] = 0.0;
  if ((poses->super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish !=
      (poses->super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>)
      ._M_impl.super__Vector_impl_data._M_start) {
    local_158 = 0;
    do {
      uVar9 = local_158 + 1;
      ppCVar10 = (poses->
                 super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      local_160 = local_158;
      uVar16 = uVar9;
      if (uVar9 < (ulong)((long)(poses->
                                super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar10 >> 3))
      {
        local_180 = local_158 * 8;
        local_158 = uVar9;
        do {
          best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          position_pair.
          super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_b8 = (undefined1  [8])0x0;
          position_pair.
          super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          std::vector<sfm::CameraPose_const*,std::allocator<sfm::CameraPose_const*>>::
          _M_realloc_insert<sfm::CameraPose_const*const&>
                    ((vector<sfm::CameraPose_const*,std::allocator<sfm::CameraPose_const*>> *)
                     &best_outliers.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(iterator)0x0,ppCVar10 + local_160);
          std::vector<sfm::CameraPose_const*,std::allocator<sfm::CameraPose_const*>>::
          _M_realloc_insert<sfm::CameraPose_const*const&>
                    ((vector<sfm::CameraPose_const*,std::allocator<sfm::CameraPose_const*>> *)
                     &best_outliers.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(iterator)0x0,
                     (poses->
                     super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar9);
          pVVar14 = (Vector<float,_2> *)
                    ((long)((positions->
                            super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->v + local_180);
          if (position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<math::Vector<float,2>,std::allocator<math::Vector<float,2>>>::
            _M_realloc_insert<math::Vector<float,2>const&>
                      ((vector<math::Vector<float,2>,std::allocator<math::Vector<float,2>>> *)
                       auStack_b8,
                       (iterator)
                       position_pair.
                       super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,pVVar14);
          }
          else {
            *(undefined8 *)
             (position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->v = *(undefined8 *)pVVar14->v;
            position_pair.
            super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 position_pair.
                 super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          pVVar14 = (positions->
                    super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar9;
          if (position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<math::Vector<float,2>,std::allocator<math::Vector<float,2>>>::
            _M_realloc_insert<math::Vector<float,2>const&>
                      ((vector<math::Vector<float,2>,std::allocator<math::Vector<float,2>>> *)
                       auStack_b8,
                       (iterator)
                       position_pair.
                       super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,pVVar14);
          }
          else {
            *(undefined8 *)
             (position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->v = *(undefined8 *)pVVar14->v;
            position_pair.
            super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 position_pair.
                 super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          triangulate_track((Vector<double,_3> *)(best_pos.v + 2),
                            (vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                             *)auStack_b8,
                            (vector<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                             *)&best_outliers.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (((!NAN((double)stack0xfffffffffffffec0 - (double)stack0xfffffffffffffec0) &&
                !NAN((double)stack0xfffffffffffffec0)) &&
              (!NAN(tmp_pos.v[0] - tmp_pos.v[0]) && !NAN(tmp_pos.v[0]))) &&
             (!NAN(tmp_pos.v[1] - tmp_pos.v[1]) && !NAN(tmp_pos.v[1]))) {
            if (0.0 < *(double *)(this + 8)) {
              uVar3 = *best_outliers.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              lVar11 = uVar3 + 0x48;
              ppVVar12 = &pVStack_108;
              lVar18 = 0;
              do {
                lVar20 = 0;
                ppVVar19 = ppVVar12;
                do {
                  *ppVVar19 = *(pointer *)(lVar11 + lVar20 * 8);
                  lVar20 = lVar20 + 1;
                  ppVVar19 = ppVVar19 + 3;
                } while (lVar20 != 3);
                lVar18 = lVar18 + 1;
                ppVVar12 = ppVVar12 + 1;
                lVar11 = lVar11 + 0x18;
              } while (lVar18 != 3);
              ppVVar12 = &pVStack_108;
              lVar11 = 0;
              do {
                pVVar5 = (pointer)0x0;
                lVar18 = 0;
                do {
                  pVVar5 = (pointer)((double)pVVar5 +
                                    *(double *)((long)ppVVar12 + lVar18) *
                                    *(double *)(uVar3 + 0x90 + lVar18));
                  lVar18 = lVar18 + 8;
                } while (lVar18 != 0x18);
                (&pVStack_48)[lVar11] = pVVar5;
                lVar11 = lVar11 + 1;
                ppVVar12 = ppVVar12 + 3;
              } while (lVar11 != 3);
              lVar11 = 0;
              do {
                *(ulong *)((long)&pVStack_48 + lVar11) =
                     *(ulong *)((long)&pVStack_48 + lVar11) ^ 0x8000000000000000;
                lVar11 = lVar11 + 8;
              } while (lVar11 != 0x18);
              camera_pos.v[1] =
                   (double)tmp_outliers.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish;
              pVStack_68 = pVStack_48;
              camera_pos.v[0] =
                   (double)tmp_outliers.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)tmp_pos.v[1];
              pVStack_48 = stack0xfffffffffffffec0;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)tmp_pos.v[0];
              lVar11 = 0;
              do {
                *(double *)((long)&pVStack_48 + lVar11) =
                     *(double *)((long)&pVStack_48 + lVar11) -
                     *(double *)((long)camera_pos.v + lVar11 + -8);
                lVar11 = lVar11 + 8;
              } while (lVar11 != 0x18);
              ret.m[1] = (double)tmp_outliers.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
              pVStack_108 = pVStack_48;
              ret.m[0] = (double)tmp_outliers.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
              dVar6 = 0.0;
              lVar11 = 0;
              do {
                dVar2 = *(double *)((long)ret.m + lVar11 + -8);
                dVar6 = dVar6 + dVar2 * dVar2;
                lVar11 = lVar11 + 8;
              } while (lVar11 != 0x18);
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              lVar11 = 0;
              do {
                *(double *)((long)ret.m + lVar11 + -8) =
                     *(double *)((long)ret.m + lVar11 + -8) / dVar6;
                lVar11 = lVar11 + 8;
              } while (lVar11 != 0x18);
              ray0.v[1] = ret.m[1];
              tmp_pos.v[2] = (double)pVStack_108;
              ray0.v[0] = ret.m[0];
              uVar3 = best_outliers.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[1];
              lVar11 = uVar3 + 0x48;
              ppVVar12 = &pVStack_108;
              lVar18 = 0;
              do {
                lVar20 = 0;
                ppVVar19 = ppVVar12;
                do {
                  *ppVVar19 = *(pointer *)(lVar11 + lVar20 * 8);
                  lVar20 = lVar20 + 1;
                  ppVVar19 = ppVVar19 + 3;
                } while (lVar20 != 3);
                lVar18 = lVar18 + 1;
                ppVVar12 = ppVVar12 + 1;
                lVar11 = lVar11 + 0x18;
              } while (lVar18 != 3);
              ppVVar12 = &pVStack_108;
              lVar11 = 0;
              do {
                pVVar5 = (pointer)0x0;
                lVar18 = 0;
                do {
                  pVVar5 = (pointer)((double)pVVar5 +
                                    *(double *)((long)ppVVar12 + lVar18) *
                                    *(double *)(uVar3 + 0x90 + lVar18));
                  lVar18 = lVar18 + 8;
                } while (lVar18 != 0x18);
                (&pVStack_48)[lVar11] = pVVar5;
                lVar11 = lVar11 + 1;
                ppVVar12 = ppVVar12 + 3;
              } while (lVar11 != 3);
              lVar11 = 0;
              do {
                *(ulong *)((long)&pVStack_48 + lVar11) =
                     *(ulong *)((long)&pVStack_48 + lVar11) ^ 0x8000000000000000;
                lVar11 = lVar11 + 8;
              } while (lVar11 != 0x18);
              camera_pos.v[1] =
                   (double)tmp_outliers.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish;
              pVStack_68 = pVStack_48;
              camera_pos.v[0] =
                   (double)tmp_outliers.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)tmp_pos.v[1];
              pVStack_48 = stack0xfffffffffffffec0;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)tmp_pos.v[0];
              lVar11 = 0;
              do {
                *(double *)((long)&pVStack_48 + lVar11) =
                     *(double *)((long)&pVStack_48 + lVar11) -
                     *(double *)((long)camera_pos.v + lVar11 + -8);
                lVar11 = lVar11 + 8;
              } while (lVar11 != 0x18);
              ret.m[1] = (double)tmp_outliers.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
              pVStack_108 = pVStack_48;
              ret.m[0] = (double)tmp_outliers.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
              dVar6 = 0.0;
              lVar11 = 0;
              do {
                dVar2 = *(double *)((long)ret.m + lVar11 + -8);
                dVar6 = dVar6 + dVar2 * dVar2;
                lVar11 = lVar11 + 8;
              } while (lVar11 != 0x18);
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              lVar11 = 0;
              do {
                *(double *)((long)ret.m + lVar11 + -8) =
                     *(double *)((long)ret.m + lVar11 + -8) / dVar6;
                lVar11 = lVar11 + 8;
              } while (lVar11 != 0x18);
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)ret.m[1];
              pVStack_48 = pVStack_108;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)ret.m[0];
              dVar6 = 0.0;
              lVar11 = 0;
              do {
                dVar6 = dVar6 + *(double *)((long)tmp_pos.v + lVar11 + 0x10) *
                                *(double *)((long)&pVStack_48 + lVar11);
                lVar11 = lVar11 + 8;
              } while (lVar11 != 0x18);
              if (*(double *)(this + 0x18) <= dVar6 && dVar6 != *(double *)(this + 0x18))
              goto LAB_00113660;
            }
            pVStack_48 = (pointer)0x0;
            tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            camera_pos.v[2] = 0.0;
            ppCVar10 = (poses->
                       super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            if ((poses->
                super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                )._M_impl.super__Vector_impl_data._M_finish != ppCVar10) {
              do {
                dVar6 = camera_pos.v[2];
                pCVar13 = ppCVar10[(long)camera_pos.v[2]];
                pMVar15 = &pCVar13->R;
                lVar11 = 0;
                do {
                  dVar2 = 0.0;
                  lVar18 = 0;
                  do {
                    dVar2 = dVar2 + *(double *)((long)pMVar15->m + lVar18) *
                                    *(double *)((long)best_pos.v + lVar18 + 8);
                    lVar18 = lVar18 + 8;
                  } while (lVar18 != 0x18);
                  tmp_pos.v[lVar11 + 2] = dVar2;
                  lVar11 = lVar11 + 1;
                  pMVar15 = (Matrix<double,_3,_3> *)(pMVar15->m + 3);
                } while (lVar11 != 3);
                ret.m[1] = ray0.v[1];
                pVStack_108 = (pointer)tmp_pos.v[2];
                ret.m[0] = ray0.v[0];
                lVar11 = 0;
                do {
                  *(double *)((long)ret.m + lVar11 + -8) =
                       *(double *)((long)ret.m + lVar11 + -8) +
                       *(double *)((long)(pCVar13->t).v + lVar11);
                  lVar11 = lVar11 + 8;
                } while (lVar11 != 0x18);
                camera_pos.v[1] = ret.m[1];
                pVStack_68 = pVStack_108;
                camera_pos.v[0] = ret.m[0];
                if (ret.m[1] <= 0.0) {
                  if (tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pVStack_48,
                               (iterator)
                               tmp_outliers.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (unsigned_long *)(camera_pos.v + 2));
                  }
                  else {
LAB_00113594:
                    *tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start = (unsigned_long)camera_pos.v[2];
                    tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((double *)
                                   tmp_outliers.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
                  }
                }
                else {
                  lVar11 = 0;
                  do {
                    dVar2 = 0.0;
                    lVar18 = 0;
                    do {
                      dVar2 = dVar2 + *(double *)((long)(pCVar13->K).m + lVar18) *
                                      *(double *)((long)camera_pos.v + lVar18 + -8);
                      lVar18 = lVar18 + 8;
                    } while (lVar18 != 0x18);
                    ret.m[lVar11 + -1] = dVar2;
                    lVar11 = lVar11 + 1;
                    pCVar13 = (CameraPose *)((pCVar13->K).m + 3);
                  } while (lVar11 != 3);
                  camera_pos.v[1] = ret.m[1];
                  pVStack_68 = pVStack_108;
                  camera_pos.v[0] = ret.m[0];
                  pVStack_108 = (pointer)((double)pVStack_108 / ret.m[1]);
                  ret.m[0] = ret.m[0] / ret.m[1];
                  pVVar5 = (positions->
                           super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  uVar16 = 3;
                  lVar11 = 0;
                  do {
                    *(float *)((long)afStack_190 + lVar11) =
                         (float)*(double *)((long)ret.m + lVar11 * 2 + -8);
                    uVar16 = uVar16 - 1;
                    lVar11 = lVar11 + 4;
                  } while (1 < uVar16);
                  tmp_pos.v[2] = *(double *)pVVar5[(long)dVar6].v;
                  lVar11 = 0;
                  do {
                    *(float *)((long)tmp_pos.v + lVar11 + 0x10) =
                         *(float *)((long)tmp_pos.v + lVar11 + 0x10) -
                         *(float *)((long)afStack_190 + lVar11);
                    lVar11 = lVar11 + 4;
                  } while (lVar11 != 8);
                  local_188 = tmp_pos.v[2];
                  fVar21 = 0.0;
                  lVar11 = 0;
                  do {
                    fVar21 = fVar21 + *(float *)((long)&local_188 + lVar11) *
                                      *(float *)((long)&local_188 + lVar11);
                    lVar11 = lVar11 + 4;
                  } while (lVar11 != 8);
                  if (fVar21 < 0.0) {
                    fVar21 = sqrtf(fVar21);
                  }
                  else {
                    fVar21 = SQRT(fVar21);
                  }
                  if (*(double *)this <= (double)fVar21 && (double)fVar21 != *(double *)this) {
                    if (tmp_outliers.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start !=
                        tmp_outliers.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish) goto LAB_00113594;
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&pVStack_48,
                               (iterator)
                               tmp_outliers.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (unsigned_long *)(camera_pos.v + 2));
                  }
                }
                camera_pos.v[2] = (double)((long)camera_pos.v[2] + 1);
                ppCVar10 = (poses->
                           super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
              } while ((ulong)camera_pos.v[2] <
                       (ulong)((long)(poses->
                                     super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar10 >>
                              3));
            }
            puVar4 = best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pVVar5 = position_pair.
                     super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((ulong)((long)tmp_outliers.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)pVStack_48) <
                (ulong)((long)best_outliers.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                       (long)position_pair.
                             super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
              uVar16 = 4;
              lVar11 = 0;
              do {
                *(float *)((long)best_pos.v + lVar11 + -8) =
                     (float)*(double *)((long)best_pos.v + lVar11 * 2 + 8);
                puVar7 = best_outliers.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                uVar16 = uVar16 - 1;
                lVar11 = lVar11 + 4;
              } while (1 < uVar16);
              position_pair.
              super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = pVStack_48;
              best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              pVStack_48 = pVVar5;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_start = puVar4;
              tmp_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_finish = puVar7;
            }
            if (pVStack_48 != (pointer)0x0) {
              operator_delete(pVStack_48);
            }
          }
LAB_00113660:
          if (auStack_b8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_b8);
          }
          if (best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete(best_outliers.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          uVar9 = uVar9 + 1;
          ppCVar10 = (poses->
                     super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          uVar16 = local_158;
        } while (uVar9 < (ulong)((long)(poses->
                                       super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar10
                                >> 3));
      }
      local_158 = uVar16;
    } while (local_158 <
             (ulong)((long)(poses->
                           super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(poses->
                           super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pSVar8 = local_178;
  fVar21 = 0.0;
  lVar11 = 0;
  do {
    fVar1 = *(float *)((long)best_pos.v + lVar11 + -8);
    fVar21 = fVar21 + fVar1 * fVar1;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0xc);
  if (fVar21 < 0.0) {
    fVar21 = sqrtf(fVar21);
  }
  else {
    fVar21 = SQRT(fVar21);
  }
  if ((fVar21 != 0.0) || (NAN(fVar21))) {
    if ((ulong)((long)*(int *)(this + 0x10) +
               ((long)best_outliers.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start -
                (long)position_pair.
                      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3)) <=
        (ulong)((long)(poses->
                      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(poses->
                      super__Vector_base<const_sfm::CameraPose_*,_std::allocator<const_sfm::CameraPose_*>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3)) {
      uVar9 = 4;
      lVar11 = 0;
      do {
        *(double *)((long)local_168->v + lVar11 * 2) =
             (double)*(float *)((long)best_pos.v + lVar11 + -8);
        uVar9 = uVar9 - 1;
        lVar11 = lVar11 + 4;
      } while (1 < uVar9);
      if (pSVar8 != (Statistics *)0x0) {
        *(int *)pSVar8 = *(int *)pSVar8 + 1;
      }
      bVar17 = true;
      if (local_170 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        pVVar5 = (pointer)(local_170->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start;
        puVar7 = (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        puVar4 = (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)position_pair.
                      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
        (local_170->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_finish;
        position_pair.
        super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = pVVar5;
        best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar7;
        best_outliers.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar4;
      }
      goto LAB_00113741;
    }
    if (pSVar8 != (Statistics *)0x0) {
      *(int *)(pSVar8 + 4) = *(int *)(pSVar8 + 4) + 1;
    }
  }
  else if (pSVar8 != (Statistics *)0x0) {
    *(int *)(pSVar8 + 0xc) = *(int *)(pSVar8 + 0xc) + 1;
  }
  bVar17 = false;
LAB_00113741:
  if (position_pair.
      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(position_pair.
                    super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return bVar17;
}

Assistant:

bool
Triangulate::triangulate (std::vector<CameraPose const*> const& poses,
    std::vector<math::Vec2f> const& positions,
    math::Vec3d* track_pos, Statistics* stats,
    std::vector<std::size_t>* outliers) const
{
    if (poses.size() < 2)
        throw std::invalid_argument("At least two poses required");
    if (poses.size() != positions.size())
        throw std::invalid_argument("Poses and positions size mismatch");

    /* Check all possible pose pairs for successful triangulation */
    std::vector<std::size_t> best_outliers(positions.size());
    math::Vec3f best_pos(0.0f);
    for (std::size_t p1 = 0; p1 < poses.size(); ++p1)
        for (std::size_t p2 = p1 + 1; p2 < poses.size(); ++p2)
        {
            /* Triangulate position from current pair */
            std::vector<CameraPose const*> pose_pair;
            std::vector<math::Vec2f> position_pair;
            pose_pair.push_back(poses[p1]);
            pose_pair.push_back(poses[p2]);
            position_pair.push_back(positions[p1]);
            position_pair.push_back(positions[p2]);
            math::Vec3d tmp_pos = triangulate_track(position_pair, pose_pair);
            if (MATH_ISNAN(tmp_pos[0]) || MATH_ISINF(tmp_pos[0]) ||
                MATH_ISNAN(tmp_pos[1]) || MATH_ISINF(tmp_pos[1]) ||
                MATH_ISNAN(tmp_pos[2]) || MATH_ISINF(tmp_pos[2]))
                continue;

            /* Check if pair has small triangulation angle. */
            if (this->opts.angle_threshold > 0.0)
            {
                math::Vec3d camera_pos;
                pose_pair[0]->fill_camera_pos(&camera_pos);
                math::Vec3d ray0 = (tmp_pos - camera_pos).normalized();
                pose_pair[1]->fill_camera_pos(&camera_pos);
                math::Vec3d ray1 = (tmp_pos - camera_pos).normalized();
                double const cos_angle = ray0.dot(ray1);
                if (cos_angle > this->cos_angle_thres)
                    continue;
            }

            /* Chek error in all input poses and find outliers. */
            std::vector<std::size_t> tmp_outliers;
            for (std::size_t i = 0; i < poses.size(); ++i)
            {
                math::Vec3d x = poses[i]->R * tmp_pos + poses[i]->t;

                /* Reject track if it appears behind the camera. */
                if (x[2] <= 0.0)
                {
                    tmp_outliers.push_back(i);
                    continue;
                }

                x = poses[i]->K * x;
                math::Vec2d x2d(x[0] / x[2], x[1] / x[2]);
                double error = (positions[i] - x2d).norm();
                if (error > this->opts.error_threshold)
                    tmp_outliers.push_back(i);
            }

            /* Select triangulation with lowest amount of outliers. */
            if (tmp_outliers.size() < best_outliers.size())
            {
                best_pos = tmp_pos;
                std::swap(best_outliers, tmp_outliers);
            }

        }

    /* If all pairs have small angles pos will be 0 here. */
    if (best_pos.norm() == 0.0f)
    {
        if (stats != nullptr)
            stats->num_too_small_angle += 1;
        return false;
    }

    /* Check if required number of inliers is found. */
    if (poses.size() < best_outliers.size() + this->opts.min_num_views)
    {
        if (stats != nullptr)
            stats->num_large_error += 1;
        return false;
    }

    /* Return final position and outliers. */
    *track_pos = best_pos;
    if (stats != nullptr)
        stats->num_new_tracks += 1;
    if (outliers != nullptr)
        std::swap(*outliers, best_outliers);

    return true;
}